

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkIntDivByZero(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp TVar2;
  LiteralKind LVar3;
  Node *this_00;
  Node *this_01;
  LiteralExpr *this_02;
  SQUnsignedInteger SVar4;
  LiteralExpr *this_03;
  SQInteger SVar5;
  SQInteger SVar6;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  LiteralExpr *lhs;
  LiteralExpr *rhs;
  Expr *divisor;
  Expr *divided;
  Expr *in_stack_ffffffffffffffb8;
  CheckerVisitor *in_stack_ffffffffffffffc0;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    TVar2 = Node::op((Node *)in_RSI);
    bVar1 = isDivOperator(TVar2);
    if (bVar1) {
      BinExpr::lhs(in_RSI);
      this_00 = &maybeEval(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false)->super_Node;
      BinExpr::rhs(in_RSI);
      this_01 = &maybeEval(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false)->super_Node;
      TVar2 = Node::op(this_01);
      if (TVar2 == TO_LITERAL) {
        this_02 = Expr::asLiteral((Expr *)this_01);
        SVar4 = LiteralExpr::raw(this_02);
        if (SVar4 == 0) {
          report(in_RDI,(Node *)in_RSI,0x56);
        }
        else {
          TVar2 = Node::op(this_00);
          if (TVar2 == TO_LITERAL) {
            this_03 = Expr::asLiteral((Expr *)this_00);
            LVar3 = LiteralExpr::kind(this_03);
            if ((LVar3 == LK_INT) && (LVar3 = LiteralExpr::kind(this_02), LVar3 == LK_INT)) {
              SVar5 = LiteralExpr::i(this_02);
              if ((SVar5 == -1) && (SVar5 = LiteralExpr::i(this_03), SVar5 == -0x8000000000000000))
              {
                report(in_RDI,(Node *)in_RSI,0x87);
              }
              else {
                SVar5 = LiteralExpr::i(this_03);
                SVar6 = LiteralExpr::i(this_02);
                if (SVar5 % SVar6 != 0) {
                  report(in_RDI,(Node *)in_RSI,0x57);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkIntDivByZero(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (isDivOperator(bin->op())) {
    const Expr *divided = maybeEval(bin->lhs());
    const Expr *divisor = maybeEval(bin->rhs());

    if (divisor->op() == TO_LITERAL) {
      const LiteralExpr *rhs = divisor->asLiteral();
      if (rhs->raw() == 0) {
        report(bin, DiagnosticsId::DI_DIV_BY_ZERO);
        return;
      }
      if (divided->op() == TO_LITERAL) {
        const LiteralExpr *lhs = divided->asLiteral();
        if (lhs->kind() == LK_INT && rhs->kind() == LK_INT) {
          if (rhs->i() == -1 && lhs->i() == MIN_SQ_INTEGER) {
            report(bin, DiagnosticsId::DI_INTEGER_OVERFLOW);
          }
          else if (lhs->i() % rhs->i() != 0) {
            report(bin, DiagnosticsId::DI_ROUND_TO_INT);
          }
        }
      }
    }
  }
}